

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

void VW::move_feature_namespace(example *dst,example *src,namespace_index c)

{
  uchar *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  features *pfVar5;
  features *pfVar6;
  long *plVar7;
  long *plVar8;
  features *pfVar9;
  features *pfVar10;
  byte bVar11;
  namespace_index c_local;
  long local_78 [13];
  
  bVar11 = 0;
  c_local = c;
  puVar1 = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                     ((src->super_example_predict).indices._begin,
                      (src->super_example_predict).indices._end,&c_local);
  if (puVar1 != (src->super_example_predict).indices._end) {
    puVar1 = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                       ((dst->super_example_predict).indices._begin,
                        (dst->super_example_predict).indices._end,&c_local);
    if (puVar1 == (dst->super_example_predict).indices._end) {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)dst,&c_local);
    }
    uVar2 = (ulong)c_local;
    pfVar10 = (src->super_example_predict).feature_space + uVar2;
    src->num_features =
         src->num_features -
         ((long)(src->super_example_predict).feature_space[uVar2].values._end -
          (long)(pfVar10->values)._begin >> 2);
    pfVar5 = (dst->super_example_predict).feature_space + uVar2;
    src->total_sum_feat_sq =
         src->total_sum_feat_sq - (src->super_example_predict).feature_space[uVar2].sum_feat_sq;
    plVar7 = local_78;
    pfVar6 = pfVar5;
    plVar8 = plVar7;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      *plVar8 = (long)(pfVar6->values)._begin;
      pfVar6 = (features *)((long)pfVar6 + ((ulong)bVar11 * -2 + 1) * 8);
      plVar8 = plVar8 + (ulong)bVar11 * -2 + 1;
    }
    lVar3 = 100;
    pfVar6 = pfVar10;
    pfVar9 = pfVar5;
    for (lVar4 = lVar3; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined1 *)&(pfVar9->values)._begin = *(undefined1 *)&(pfVar6->values)._begin;
      pfVar6 = (features *)((long)pfVar6 + (ulong)bVar11 * -2 + 1);
      pfVar9 = (features *)((long)pfVar9 + (ulong)bVar11 * -2 + 1);
    }
    for (; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(char *)&(pfVar10->values)._begin = (char)*plVar7;
      plVar7 = (long *)((long)plVar7 + (ulong)bVar11 * -2 + 1);
      pfVar10 = (features *)((long)pfVar10 + (ulong)bVar11 * -2 + 1);
    }
    dst->num_features =
         dst->num_features +
         ((long)(dst->super_example_predict).feature_space[uVar2].values._end -
          (long)(pfVar5->values)._begin >> 2);
    dst->total_sum_feat_sq =
         (dst->super_example_predict).feature_space[uVar2].sum_feat_sq + dst->total_sum_feat_sq;
  }
  return;
}

Assistant:

void move_feature_namespace(example* dst, example* src, namespace_index c)
{
  if (std::find(src->indices.begin(), src->indices.end(), c) == src->indices.end())
    return;  // index not present in src
  if (std::find(dst->indices.begin(), dst->indices.end(), c) == dst->indices.end())
    dst->indices.push_back(c);

  auto& fdst = dst->feature_space[c];
  auto& fsrc = src->feature_space[c];

  src->num_features -= fsrc.size();
  src->total_sum_feat_sq -= fsrc.sum_feat_sq;
  std::swap(fdst, fsrc);
  dst->num_features += fdst.size();
  dst->total_sum_feat_sq += fdst.sum_feat_sq;
}